

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationKeyFrames
          (OgreXmlSerializer *this,Animation *anim,VertexAnimationTrack *dest)

{
  aiVector3t<float> axis_00;
  bool bVar1;
  string *__lhs;
  DeadlyImportError *this_00;
  Logger *this_01;
  basic_formatter *this_02;
  bool local_271;
  undefined1 local_248 [16];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_c0;
  undefined1 local_9c [8];
  aiVector3D axis;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  float local_5c;
  undefined1 local_58 [4];
  float angle;
  TransformKeyFrame keyframe;
  aiVector3D zeroVec;
  VertexAnimationTrack *dest_local;
  Animation *anim_local;
  OgreXmlSerializer *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&keyframe.scale.y,0.0,0.0,0.0);
  NextNode_abi_cxx11_(this);
  do {
    bVar1 = std::operator==(&this->m_currentNodeName,nnKeyFrame);
    if (!bVar1) {
      return;
    }
    TransformKeyFrame::TransformKeyFrame((TransformKeyFrame *)local_58);
    local_58 = (undefined1  [4])ReadAttribute<float>(this,"time");
    NextNode_abi_cxx11_(this);
    while( true ) {
      bVar1 = std::operator==(&this->m_currentNodeName,nnTranslate);
      local_271 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&this->m_currentNodeName,nnRotate);
        local_271 = true;
        if (!bVar1) {
          local_271 = std::operator==(&this->m_currentNodeName,nnScale);
        }
      }
      if (local_271 == false) break;
      bVar1 = std::operator==(&this->m_currentNodeName,nnTranslate);
      if (bVar1) {
        keyframe.rotation.y = ReadAttribute<float>(this,anX);
        keyframe.rotation.z = ReadAttribute<float>(this,anY);
        keyframe.position.x = ReadAttribute<float>(this,anZ);
      }
      else {
        bVar1 = std::operator==(&this->m_currentNodeName,nnRotate);
        if (bVar1) {
          local_5c = ReadAttribute<float>(this,"angle");
          __lhs = NextNode_abi_cxx11_(this);
          bVar1 = std::operator!=(__lhs,nnAxis);
          if (bVar1) {
            axis.y._3_1_ = 1;
            this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::operator+(&local_80,"No axis specified for keyframe rotation in animation ",
                           &anim->name);
            DeadlyImportError::DeadlyImportError(this_00,&local_80);
            axis.y._3_1_ = 0;
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_9c);
          local_9c._0_4_ = ReadAttribute<float>(this,anX);
          local_9c._4_4_ = ReadAttribute<float>(this,anY);
          axis.x = ReadAttribute<float>(this,anZ);
          bVar1 = aiVector3t<float>::Equal
                            ((aiVector3t<float> *)local_9c,(aiVector3t<float> *)&keyframe.scale.y,
                             1e-06);
          if (bVar1) {
            local_9c._0_4_ = 1.0;
            if ((local_5c != 0.0) || (NAN(local_5c))) {
              this_01 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[67]>
                        (&local_238,
                         (char (*) [67])
                         "Found invalid a key frame with a zero rotation axis in animation: ");
              this_02 = (basic_formatter *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_238,&anim->name);
              Formatter::basic_formatter::operator_cast_to_string(&local_c0,this_02);
              Logger::warn(this_01,&local_c0);
              std::__cxx11::string::~string((string *)&local_c0);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter(&local_238);
            }
          }
          axis_00.y = (float)local_9c._4_4_;
          axis_00.x = (float)local_9c._0_4_;
          axis_00.z = axis.x;
          aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_248,axis_00,local_5c);
          angle = (float)local_248._0_4_;
          keyframe.timePos = (float)local_248._4_4_;
          keyframe.rotation.w = (float)local_248._8_4_;
          keyframe.rotation.x = (float)local_248._12_4_;
        }
        else {
          bVar1 = std::operator==(&this->m_currentNodeName,nnScale);
          if (bVar1) {
            keyframe.position.y = ReadAttribute<float>(this,anX);
            keyframe.position.z = ReadAttribute<float>(this,anY);
            keyframe.scale.x = ReadAttribute<float>(this,anZ);
          }
        }
      }
      NextNode_abi_cxx11_(this);
    }
    std::vector<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>::
    push_back(&dest->transformKeyFrames,(value_type *)local_58);
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *dest)
{
    const aiVector3D zeroVec(0.f, 0.f, 0.f);

    NextNode();
    while(m_currentNodeName == nnKeyFrame)
    {
        TransformKeyFrame keyframe;
        keyframe.timePos = ReadAttribute<float>("time");

        NextNode();
        while(m_currentNodeName == nnTranslate || m_currentNodeName == nnRotate || m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnTranslate)
            {
                keyframe.position.x = ReadAttribute<float>(anX);
                keyframe.position.y = ReadAttribute<float>(anY);
                keyframe.position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotate)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError("No axis specified for keyframe rotation in animation " + anim->name);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);
                if (axis.Equal(zeroVec))
                {
                    axis.x = 1.0f;
                    if (angle != 0) {
                        ASSIMP_LOG_WARN_F("Found invalid a key frame with a zero rotation axis in animation: ", anim->name);
                    }
                }
                keyframe.rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                keyframe.scale.x = ReadAttribute<float>(anX);
                keyframe.scale.y = ReadAttribute<float>(anY);
                keyframe.scale.z = ReadAttribute<float>(anZ);
            }

            NextNode();
        }

        dest->transformKeyFrames.push_back(keyframe);
    }
}